

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O3

bool __thiscall
QHttpSocketEngine::waitForRead(QHttpSocketEngine *this,QDeadlineTimer deadline,bool *timedOut)

{
  long lVar1;
  long *plVar2;
  char cVar3;
  bool bVar4;
  SocketState SVar5;
  undefined4 uVar6;
  SocketError SVar7;
  long lVar8;
  undefined8 uVar9;
  qint64 qVar10;
  long in_FS_OFFSET;
  QDeadlineTimer deadline_00;
  QString local_60;
  qint64 local_48;
  undefined8 local_40;
  long local_38;
  
  uVar9 = deadline._8_8_;
  qVar10 = deadline.t1;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_48 = qVar10;
  local_40 = uVar9;
  if ((*(QAbstractSocket **)(lVar1 + 0xf8) != (QAbstractSocket *)0x0) &&
     (SVar5 = QAbstractSocket::state(*(QAbstractSocket **)(lVar1 + 0xf8)), SVar5 != UnconnectedState
     )) {
    lVar8 = (**(code **)(**(long **)(lVar1 + 0xf8) + 0xa0))();
    if (lVar8 == 0) {
      plVar2 = *(long **)(lVar1 + 0xf8);
      uVar6 = QDeadlineTimer::remainingTime();
      cVar3 = (**(code **)(*plVar2 + 0xb8))(plVar2,uVar6);
      qVar10 = local_48;
      uVar9 = local_40;
      if (cVar3 != '\0') goto LAB_00223c23;
      SVar5 = QAbstractSocket::state(*(QAbstractSocket **)(lVar1 + 0xf8));
      if (SVar5 == UnconnectedState) {
        bVar4 = true;
        goto LAB_00223cbe;
      }
    }
    else {
LAB_00223c23:
      deadline_00.t2 = (int)uVar9;
      deadline_00.type = (int)((ulong)uVar9 >> 0x20);
      deadline_00.t1 = qVar10;
      waitForProtocolHandshake(this,deadline_00);
      bVar4 = true;
      if (*(int *)(lVar1 + 0x108) == 2) goto LAB_00223cbe;
    }
    SVar7 = QAbstractSocket::error(*(QAbstractSocket **)(lVar1 + 0xf8));
    QIODevice::errorString();
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,SVar7,&local_60);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((timedOut != (bool *)0x0) &&
       (SVar7 = QAbstractSocket::error(*(QAbstractSocket **)(lVar1 + 0xf8)),
       SVar7 == SocketTimeoutError)) {
      *timedOut = true;
    }
  }
  bVar4 = false;
LAB_00223cbe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QHttpSocketEngine::waitForRead(QDeadlineTimer deadline, bool *timedOut)
{
    Q_D(const QHttpSocketEngine);

    if (!d->socket || d->socket->state() == QAbstractSocket::UnconnectedState)
        return false;

    // Wait for more data if nothing is available.
    if (!d->socket->bytesAvailable()) {
        if (!d->socket->waitForReadyRead(deadline.remainingTime())) {
            if (d->socket->state() == QAbstractSocket::UnconnectedState)
                return true;
            setError(d->socket->error(), d->socket->errorString());
            if (timedOut && d->socket->error() == QAbstractSocket::SocketTimeoutError)
                *timedOut = true;
            return false;
        }
    }

    waitForProtocolHandshake(deadline);

    // Report any error that may occur.
    if (d->state != Connected) {
        setError(d->socket->error(), d->socket->errorString());
        if (timedOut && d->socket->error() == QAbstractSocket::SocketTimeoutError)
            *timedOut = true;
        return false;
    }
    return true;
}